

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cStack_448;
  char cStack_447;
  char cStack_446;
  char cStack_445;
  char cStack_444;
  char cStack_443;
  char cStack_442;
  char cStack_441;
  char buffer [1024];
  char *local_38;
  
  iVar3 = stbi__hdr_test(s);
  if (iVar3 != 0) {
    buffer._1016_8_ = comp;
    stbi__hdr_gettoken(s,&cStack_448);
    if (cStack_448 != '\0') {
      bVar1 = false;
      do {
        auVar6[0] = -(cStack_441 == '3');
        auVar6[1] = -(buffer[0] == '2');
        auVar6[2] = -(buffer[1] == '-');
        auVar6[3] = -(buffer[2] == 'b');
        auVar6[4] = -(buffer[3] == 'i');
        auVar6[5] = -(buffer[4] == 't');
        auVar6[6] = -(buffer[5] == '_');
        auVar6[7] = -(buffer[6] == 'r');
        auVar6[8] = -(buffer[7] == 'l');
        auVar6[9] = -(buffer[8] == 'e');
        auVar6[10] = -(buffer[9] == '_');
        auVar6[0xb] = -(buffer[10] == 'r');
        auVar6[0xc] = -(buffer[0xb] == 'g');
        auVar6[0xd] = -(buffer[0xc] == 'b');
        auVar6[0xe] = -(buffer[0xd] == 'e');
        auVar6[0xf] = -(buffer[0xe] == '\0');
        auVar7[0] = -(cStack_448 == 'F');
        auVar7[1] = -(cStack_447 == 'O');
        auVar7[2] = -(cStack_446 == 'R');
        auVar7[3] = -(cStack_445 == 'M');
        auVar7[4] = -(cStack_444 == 'A');
        auVar7[5] = -(cStack_443 == 'T');
        auVar7[6] = -(cStack_442 == '=');
        auVar7[7] = -(cStack_441 == '3');
        auVar7[8] = -(buffer[0] == '2');
        auVar7[9] = -(buffer[1] == '-');
        auVar7[10] = -(buffer[2] == 'b');
        auVar7[0xb] = -(buffer[3] == 'i');
        auVar7[0xc] = -(buffer[4] == 't');
        auVar7[0xd] = -(buffer[5] == '_');
        auVar7[0xe] = -(buffer[6] == 'r');
        auVar7[0xf] = -(buffer[7] == 'l');
        auVar7 = auVar7 & auVar6;
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&cStack_448);
      } while (cStack_448 != '\0');
      if (bVar1) {
        stbi__hdr_gettoken(s,&cStack_448);
        if (cStack_446 == ' ' && (short)_cStack_448 == 0x592d) {
          local_38 = &cStack_445;
          lVar4 = strtol(local_38,&local_38,10);
          uVar2 = buffer._1016_8_;
          if (y != (int *)0x0) {
            *y = (int)lVar4;
          }
          local_38 = local_38 + 2;
          do {
            pcVar5 = local_38;
            local_38 = pcVar5 + 1;
          } while (pcVar5[-2] == ' ');
          if (((pcVar5[-2] == '+') && (pcVar5[-1] == 'X')) && (*pcVar5 == ' ')) {
            lVar4 = strtol(local_38,(char **)0x0,10);
            if (x != (int *)0x0) {
              *x = (int)lVar4;
            }
            if (uVar2 == 0) {
              return 1;
            }
            *(undefined4 *)uVar2 = 3;
            return 1;
          }
        }
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int dummy;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}